

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Scene.cpp
# Opt level: O2

string * __thiscall
pbrt::syntactic::ParamSet::getParamString
          (string *__return_storage_ptr__,ParamSet *this,string *name)

{
  int iVar1;
  const_iterator cVar2;
  undefined4 extraout_var;
  runtime_error *prVar3;
  shared_ptr<pbrt::syntactic::ParamArray<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  p;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_78;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_58;
  shared_ptr<pbrt::syntactic::Param> pr;
  
  cVar2 = std::
          _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<pbrt::syntactic::Param>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<pbrt::syntactic::Param>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<pbrt::syntactic::Param>_>_>_>
          ::find((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<pbrt::syntactic::Param>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<pbrt::syntactic::Param>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<pbrt::syntactic::Param>_>_>_>
                  *)this,name);
  if ((_Rb_tree_header *)cVar2._M_node == &(this->param)._M_t._M_impl.super__Rb_tree_header) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)__return_storage_ptr__,"",(allocator<char> *)&local_78);
  }
  else {
    std::__shared_ptr<pbrt::syntactic::Param,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
              (&pr.super___shared_ptr<pbrt::syntactic::Param,_(__gnu_cxx::_Lock_policy)2>,
               (__shared_ptr<pbrt::syntactic::Param,_(__gnu_cxx::_Lock_policy)2> *)
               (cVar2._M_node + 2));
    std::
    dynamic_pointer_cast<pbrt::syntactic::ParamArray<std::__cxx11::string>,pbrt::syntactic::Param>
              ((shared_ptr<pbrt::syntactic::Param> *)&p);
    if (p.
        super___shared_ptr<pbrt::syntactic::ParamArray<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_(__gnu_cxx::_Lock_policy)2>
        ._M_ptr == (element_type *)0x0) {
      prVar3 = (runtime_error *)__cxa_allocate_exception(0x10);
      std::operator+(&local_58,"str: found param of given name (",name);
      std::operator+(&local_78,&local_58,"), but of wrong type!");
      std::runtime_error::runtime_error(prVar3,(string *)&local_78);
      __cxa_throw(prVar3,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
    }
    iVar1 = (*((p.
                super___shared_ptr<pbrt::syntactic::ParamArray<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_(__gnu_cxx::_Lock_policy)2>
               ._M_ptr)->super_Param)._vptr_Param[1])();
    if (CONCAT44(extraout_var,iVar1) != 1) {
      prVar3 = (runtime_error *)__cxa_allocate_exception(0x10);
      std::operator+(&local_58,
                     "found param of given name and type, but wrong number of components! (str, name=\'"
                     ,name);
      std::operator+(&local_78,&local_58,"\'");
      std::runtime_error::runtime_error(prVar3,(string *)&local_78);
      __cxa_throw(prVar3,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
    }
    std::__cxx11::string::string
              ((string *)__return_storage_ptr__,
               (string *)
               ((p.
                 super___shared_ptr<pbrt::syntactic::ParamArray<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_(__gnu_cxx::_Lock_policy)2>
                ._M_ptr)->
               super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ).
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              (&p.
                super___shared_ptr<pbrt::syntactic::ParamArray<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_(__gnu_cxx::_Lock_policy)2>
                ._M_refcount);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              (&pr.super___shared_ptr<pbrt::syntactic::Param,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string ParamSet::getParamString(const std::string &name) const
    {
      std::map<std::string,std::shared_ptr<Param> >::const_iterator it=param.find(name);
      if (it == param.end())
        return "";
      std::shared_ptr<Param> pr = it->second;
      const std::shared_ptr<ParamArray<std::string>> p = std::dynamic_pointer_cast<ParamArray<std::string>>(pr);
      if (!p)
        throw std::runtime_error("str: found param of given name ("+name+"), but of wrong type!");
      if (p->getSize() != 1)
        throw std::runtime_error("found param of given name and type, but wrong number of components! (str, name='"+name+"'");
      return p->get(0);
    }